

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O2

vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
* field::compute_powers
            (vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
             *__return_storage_ptr__,vector<field::GF2E,_std::allocator<field::GF2E>_> *Rs,
            size_t maxpow)

{
  GF2E GVar1;
  size_t i;
  ulong uVar2;
  undefined8 *puVar3;
  long lVar4;
  ulong uVar5;
  allocator_type local_41;
  size_t local_40;
  ulong local_38;
  
  local_40 = maxpow;
  std::
  vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
  ::vector(__return_storage_ptr__,
           (long)(Rs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(Rs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3,&local_41);
  uVar5 = 0;
  while (uVar5 < (ulong)((long)(Rs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(Rs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3)) {
    std::vector<field::GF2E,_std::allocator<field::GF2E>_>::resize
              ((__return_storage_ptr__->
               super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar5,local_40);
    puVar3 = (__return_storage_ptr__->
             super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[uVar5].
             super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>._M_impl.
             super__Vector_impl_data._M_start;
    *puVar3 = 1;
    lVar4 = 0;
    local_38 = uVar5;
    for (uVar2 = 1; uVar2 < local_40; uVar2 = uVar2 + 1) {
      GVar1 = GF2E::operator*((GF2E *)((long)puVar3 + lVar4),
                              (Rs->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                              _M_impl.super__Vector_impl_data._M_start + uVar5);
      puVar3 = (__return_storage_ptr__->
               super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar5].
               super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(uint64_t *)((long)puVar3 + lVar4 + 8) = GVar1.data;
      lVar4 = lVar4 + 8;
    }
    uVar5 = local_38 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<GF2E>> compute_powers(std::vector<GF2E> Rs, size_t maxpow)
{
   std::vector<std::vector<GF2E>> res(Rs.size());
   for (size_t nbel = 0; nbel < Rs.size(); nbel ++)
   {
      res[nbel].resize(maxpow);
      res[nbel][0] = 1;
      for (size_t i=1; i < maxpow ; i++)
      {
         res[nbel][i] = res[nbel][i-1]*Rs[nbel];
      }
   }

   return res;
}